

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O3

void __thiscall egc::Sequencer::BZMF(Sequencer *this,unsigned_short instruction)

{
  long lVar1;
  long lVar2;
  unsigned_short word;
  ostream *poVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BZMF",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 0x40;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  word = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,0,0);
  if (word == 0 || (word >> 0xe & 1) != 0) {
    Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,5,instruction & 0xfff);
  }
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                0,word);
  return;
}

Assistant:

void egc::Sequencer::BZMF (unsigned short instruction)
{
    unsigned short k = instruction & 007777u;

    std::cout << "BZMF" << " " << std::oct << k << std::dec << std::endl;

    auto a = m_Memory->Read(000000u);

    if (a == 000000u || a & 040000u)
    {
        m_Memory->Write(00005u, k);
    }

    m_Memory->Write(00000u, a);
}